

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O3

void list_store_insert(t_list_store *x,t_symbol *s,int argc,t_atom *argv)

{
  uint uVar1;
  uint uVar2;
  int in_R8D;
  t_float tVar3;
  
  if (argc < 2) {
    return;
  }
  tVar3 = atom_getfloat(argv);
  uVar2 = (uint)tVar3;
  if (-1 < (int)uVar2) {
    uVar1 = (x->x_alist).l_n;
    if ((int)uVar1 < (int)uVar2) {
      uVar2 = uVar1;
    }
    list_store_doinsert(x,(t_symbol *)(ulong)(argc - 1),(int)argv + 0x10,(t_atom *)(ulong)uVar2,
                        in_R8D);
    return;
  }
  pd_error(x,"list_store_insert: index %d out of range",(ulong)uVar2);
  return;
}

Assistant:

static void list_store_insert(t_list_store *x, t_symbol *s,
    int argc, t_atom *argv)
{
    if (argc > 1)
    {
        int index = atom_getfloat(argv);
        if (index < 0)
        {
            pd_error(x, "list_store_insert: index %d out of range", index);
            return;
        } else if (index > x->x_alist.l_n)
            index = x->x_alist.l_n;
        list_store_doinsert(x, s, --argc, ++argv, index);
    }
}